

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  uint uVar2;
  BlockCnt *pBVar3;
  int iVar4;
  ulong uVar5;
  Upvaldesc *pUVar6;
  
  if (fs == (FuncState *)0x0) {
    return 0;
  }
  uVar5 = (ulong)fs->nactvar;
  while (0 < (int)uVar5) {
    iVar1 = luaS_eqstr(n,fs->f->locvars
                         [(fs->ls->dyd->actvar).arr[(long)fs->firstlocal + uVar5 + -1].idx].varname)
    ;
    uVar5 = uVar5 - 1;
    if (iVar1 != 0) {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = (int)uVar5;
      if (base != 0) {
        return 7;
      }
      pBVar3 = (BlockCnt *)&fs->bl;
      do {
        pBVar3 = pBVar3->previous;
      } while ((int)uVar5 + 1 <= (int)(uint)pBVar3->nactvar);
      pBVar3->upval = '\x01';
      return 7;
    }
  }
  if (fs->nups != '\0') {
    pUVar6 = fs->f->upvalues;
    uVar5 = 0;
    do {
      iVar1 = luaS_eqstr(pUVar6->name,n);
      if (iVar1 != 0) goto LAB_0010f2d2;
      uVar5 = uVar5 + 1;
      pUVar6 = pUVar6 + 1;
    } while (uVar5 < fs->nups);
  }
  iVar4 = 0;
  iVar1 = singlevaraux(fs->prev,n,var,0);
  if (iVar1 != 0) {
    uVar2 = newupvalue(fs,n,var);
    uVar5 = (ulong)uVar2;
LAB_0010f2d2:
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
    (var->u).info = (int)uVar5;
    iVar4 = 8;
  }
  return iVar4;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    return VVOID;  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      init_exp(var, VLOCAL, v);  /* variable is local */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        if (singlevaraux(fs->prev, n, var, 0) == VVOID) /* try upper levels */
          return VVOID;  /* not found; is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx);
      return VUPVAL;
    }
  }
}